

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::ScopedTrace::PushTrace(ScopedTrace *this,char *file,int line,string *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TraceInfo trace;
  TraceInfo local_40;
  
  paVar1 = &local_40.message.field_2;
  local_40.message._M_string_length = 0;
  local_40.message.field_2._M_local_buf[0] = '\0';
  local_40.file = file;
  local_40.line = line;
  local_40.message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
            (&local_40.message,message);
  UnitTest::GetInstance();
  UnitTest::PushGTestTrace(&UnitTest::GetInstance::instance,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.message._M_dataplus._M_p,
                    CONCAT71(local_40.message.field_2._M_allocated_capacity._1_7_,
                             local_40.message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}